

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroStoreUnaligned
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  MipsImmediateType MVar1;
  MipsImmediateType MVar2;
  element_type *peVar3;
  CAssemblerCommand *this;
  undefined4 in_register_0000000c;
  long *plVar4;
  char *pcVar5;
  uint in_R8D;
  uint uVar6;
  long lVar7;
  initializer_list<AssemblyTemplateArgument> variables;
  string size;
  string op;
  string macroText;
  undefined1 *local_160;
  char *local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  undefined1 *local_140;
  long local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  MipsRegisterData *local_120;
  string local_118;
  char *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  char *local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  char *local_a8;
  string local_a0;
  char *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_140 = &local_130;
  local_138 = 0;
  local_130 = 0;
  local_160 = &local_150;
  local_158 = (char *)0x0;
  local_150 = 0;
  uVar6 = in_R8D & 0xf;
  local_120 = registers;
  if (uVar6 == 3) {
    pcVar5 = 
    "\n\t\t\t.if (%off% < 0x8000) && ((%off%+1) >= 0x8000)\n\t\t\t\t.error \"Immediate offset too big\"\n\t\t\t.else\n\t\t\t\tsb\t\t%rd%,%off%(%rs%)\n\t\t\t\tsrl\t\tr1,%rd%,8\n\t\t\t\tsb\t\tr1,%off%+1(%rs%)\n\t\t\t.endif\n\t\t"
    ;
  }
  else {
    if ((uVar6 | 2) != 7) {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_0018372a;
    }
    MVar1 = (immediates->secondary).type;
    MVar2 = *(MipsImmediateType *)
             &immediates[1].secondary.expression.expression.
              super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (MVar1 == MVar2) {
      Logger::printError<>(Error,"Cannot use same register as source and destination");
      this = (CAssemblerCommand *)operator_new(0x18);
      this->_vptr_CAssemblerCommand = (_func_int **)0x0;
      this->FileNum = 0;
      this->FileLine = 0;
      *(undefined8 *)&this->section = 0;
      CAssemblerCommand::CAssemblerCommand(this);
      this->_vptr_CAssemblerCommand = (_func_int **)&PTR__CAssemblerCommand_001be968;
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)this;
    }
    else {
      pcVar5 = "usd";
      if (uVar6 == 5) {
        pcVar5 = "usw";
      }
      std::__cxx11::string::_M_replace((ulong)&local_140,0,(char *)0x0,(ulong)(pcVar5 + 1));
      pcVar5 = "8";
      if (uVar6 == 5) {
        pcVar5 = "4";
      }
      std::__cxx11::string::_M_replace((ulong)&local_160,0,local_158,(ulong)pcVar5);
    }
    if (MVar1 == MVar2) goto LAB_0018372a;
    pcVar5 = 
    "\n\t\t\t.if (%off% < 0x8000) && ((%off%+%size%-1) >= 0x8000)\n\t\t\t\t.error \"Immediate offset too big\"\n\t\t\t.else\n\t\t\t\t%op%l\t%rd%,%off%+%size%-1(%rs%)\n\t\t\t\t%op%r\t%rd%,%off%(%rs%)\n\t\t\t.endif\n\t\t"
    ;
  }
  preprocessMacro_abi_cxx11_
            (&local_118,pcVar5,(MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_f8 = "%rs%";
  local_f0[0] = local_e0;
  peVar3 = (immediates->primary).expression.expression.
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,peVar3,
             (long)&((immediates->primary).expression.expression.
                     super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + (long)peVar3);
  local_d0 = "%rd%";
  local_c8[0] = local_b8;
  lVar7 = *(long *)&immediates[1].primary.expression.constExpression;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,lVar7,*(long *)&immediates[1].primary.value + lVar7);
  local_a8 = "%off%";
  Expression::toString_abi_cxx11_
            (&local_a0,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->primary).expression);
  local_80 = "%op%";
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_140,local_140 + local_138);
  local_58 = "%size%";
  plVar4 = local_40;
  local_50[0] = plVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_160,local_158 + (long)local_160);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_f8;
  createMacro(parser,(string *)local_120,(int)&local_118,variables);
  lVar7 = -200;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -5;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
LAB_0018372a:
  if (local_160 != &local_150) {
    operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroStoreUnaligned(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	std::string op, size;
	int type = flags & MIPSM_ACCESSMASK;
	if (type == MIPSM_HW)
	{
		const char* templateHalfword = R"(
			.if (%off% < 0x8000) && ((%off%+1) >= 0x8000)
				.error "Immediate offset too big"
			.else
				sb		%rd%,%off%(%rs%)
				srl		r1,%rd%,8
				sb		r1,%off%+1(%rs%)
			.endif
		)";

		selectedTemplate = templateHalfword;
	} else if (type == MIPSM_W || type == MIPSM_DW)
	{
		const char* templateWord = R"(
			.if (%off% < 0x8000) && ((%off%+%size%-1) >= 0x8000)
				.error "Immediate offset too big"
			.else
				%op%l	%rd%,%off%+%size%-1(%rs%)
				%op%r	%rd%,%off%(%rs%)
			.endif
		)";

		if (registers.grs.num == registers.grd.num)
		{
			Logger::printError(Logger::Error, "Cannot use same register as source and destination");
			return std::make_unique<DummyCommand>();
		}

		op = type == MIPSM_W ? "sw" : "sd";
		size = type == MIPSM_W ? "4" : "8";
		selectedTemplate = templateWord;
	} else {
		return nullptr;
	}

	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%rs%",		registers.grs.name.string() },
			{ "%rd%",		registers.grd.name.string() },
			{ "%off%",		immediates.primary.expression.toString() },
			{ "%op%",		op },
			{ "%size%",	size },
	});
}